

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSAtom JS_NewAtomStr(JSContext *ctx,JSString *p)

{
  JSRuntime *rt;
  BOOL BVar1;
  JSAtom JVar2;
  undefined8 in_RAX;
  uint32_t n;
  
  n = (uint32_t)((ulong)in_RAX >> 0x20);
  rt = ctx->rt;
  BVar1 = is_num_string(&n,p);
  if (-1 < (int)n && BVar1 != 0) {
    js_free_string(rt,p);
    return n | 0x80000000;
  }
  JVar2 = __JS_NewAtom(rt,p,1);
  return JVar2;
}

Assistant:

static JSAtom JS_NewAtomStr(JSContext *ctx, JSString *p)
{
    JSRuntime *rt = ctx->rt;
    uint32_t n;
    if (is_num_string(&n, p)) {
        if (n <= JS_ATOM_MAX_INT) {
            js_free_string(rt, p);
            return __JS_AtomFromUInt32(n);
        }
    }
    /* XXX: should generate an exception */
    return __JS_NewAtom(rt, p, JS_ATOM_TYPE_STRING);
}